

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O3

void __thiscall cmCTestMultiProcessHandler::PrintTestList(cmCTestMultiProcessHandler *this)

{
  cmCTestTestHandler *pcVar1;
  cmCTest *pcVar2;
  pointer pbVar3;
  char cVar4;
  bool bVar5;
  _Rb_tree_node_base *p_Var6;
  ostream *poVar7;
  _Base_ptr p_Var8;
  ulong uVar9;
  string *label;
  pointer pbVar10;
  _Rb_tree_color _Var11;
  long lVar12;
  cmCTestTestProperties *pcVar13;
  ostringstream cmCTestLog_msg_5;
  ostringstream indexStr;
  cmWorkingDirectory workdir;
  cmCTestRunTest testRun;
  long *local_608;
  long local_600;
  long local_5f8 [2];
  cmCTestTestProperties *local_5e8;
  _Base_ptr local_5e0;
  _Base_ptr local_5d8;
  long *local_5d0 [2];
  long local_5c0 [12];
  ios_base local_560 [264];
  long *local_458 [2];
  long local_448 [12];
  ios_base local_3e8 [264];
  cmWorkingDirectory local_2e0;
  undefined1 local_2b8 [448];
  int local_f8;
  
  bVar5 = cmCTest::GetOutputAsJson(this->CTest);
  if (bVar5) {
    PrintOutputAsJson(this);
    return;
  }
  pcVar1 = this->TestHandler;
  _Var11 = _S_red;
  for (p_Var6 = (this->Tests).
                super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 !=
      &(this->Tests).
       super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
       ._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    if ((int)_Var11 < (int)p_Var6[1]._M_color) {
      _Var11 = p_Var6[1]._M_color;
    }
  }
  pcVar1->MaxIndex = _Var11;
  p_Var8 = (this->Properties).
           super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_5e0 = &(this->Properties).
               super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
               ._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var8 != local_5e0) {
    do {
      pcVar13 = (cmCTestTestProperties *)p_Var8[1]._M_parent;
      local_5d8 = p_Var8;
      cmWorkingDirectory::cmWorkingDirectory(&local_2e0,&pcVar13->Directory);
      cmCTestRunTest::cmCTestRunTest((cmCTestRunTest *)local_2b8,this);
      local_f8 = pcVar13->Index;
      local_2b8._0_8_ = pcVar13;
      cmCTestRunTest::ComputeArguments((cmCTestRunTest *)local_2b8);
      local_5e8 = pcVar13;
      if ((pcVar13->Labels).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pcVar13->Labels).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_458);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,"Labels:",7);
        pcVar13 = local_5e8;
        pcVar2 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x517,(char *)local_5d0[0],this->Quiet);
        if (local_5d0[0] != local_5c0) {
          operator_delete(local_5d0[0],local_5c0[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_458);
        std::ios_base::~ios_base(local_3e8);
        pbVar10 = (pcVar13->Labels).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar3 = (pcVar13->Labels).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar10 != pbVar3) {
          do {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_458);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458," ",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_458,(pbVar10->_M_dataplus)._M_p,pbVar10->_M_string_length);
            pcVar2 = this->CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar2,5,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                         ,0x51b,(char *)local_5d0[0],this->Quiet);
            if (local_5d0[0] != local_5c0) {
              operator_delete(local_5d0[0],local_5c0[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_458);
            std::ios_base::~ios_base(local_3e8);
            pbVar10 = pbVar10 + 1;
          } while (pbVar10 != pbVar3);
          if ((local_5e8->Labels).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (local_5e8->Labels).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_458);
            cVar4 = (char)(ostringstream *)local_458;
            std::ios::widen((char)local_458[0][-3] + cVar4);
            std::ostream::put(cVar4);
            std::ostream::flush();
            pcVar2 = this->CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar2,5,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                         ,0x520,(char *)local_5d0[0],this->Quiet);
            if (local_5d0[0] != local_5c0) {
              operator_delete(local_5d0[0],local_5c0[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_458);
            std::ios_base::~ios_base(local_3e8);
          }
        }
      }
      if (this->TestHandler->MemCheck == true) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_458);
        pcVar13 = local_5e8;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_458,"  Memory Check",0xe);
        pcVar2 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x525,(char *)local_5d0[0],this->Quiet);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_458);
        pcVar13 = local_5e8;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,"  Test",6);
        pcVar2 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x527,(char *)local_5d0[0],this->Quiet);
      }
      if (local_5d0[0] != local_5c0) {
        operator_delete(local_5d0[0],local_5c0[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_458);
      std::ios_base::~ios_base(local_3e8);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_458);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458," #",2);
      poVar7 = (ostream *)std::ostream::operator<<((ostringstream *)local_458,pcVar13->Index);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5d0);
      uVar9 = (ulong)this->TestHandler->MaxIndex;
      lVar12 = 4;
      if (9 < uVar9) {
        do {
          lVar12 = lVar12 + 1;
          bVar5 = 99 < uVar9;
          uVar9 = uVar9 / 10;
        } while (bVar5);
      }
      *(long *)((long)local_5c0 + local_5d0[0][-3]) = lVar12;
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_5d0,(char *)local_608,local_600);
      if (local_608 != local_5f8) {
        operator_delete(local_608,local_5f8[0] + 1);
      }
      pcVar2 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x52f,(char *)local_608,this->Quiet);
      if (local_608 != local_5f8) {
        operator_delete(local_608,local_5f8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5d0);
      std::ios_base::~ios_base(local_560);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5d0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0," ",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_5d0,(pcVar13->Name)._M_dataplus._M_p,
                 (long)(pcVar13->Name)._M_string_length);
      pcVar2 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x531,(char *)local_608,this->Quiet);
      if (local_608 != local_5f8) {
        operator_delete(local_608,local_5f8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5d0);
      std::ios_base::~ios_base(local_560);
      if (pcVar13->Disabled == true) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5d0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d0," (Disabled)",0xb);
        pcVar2 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x534,(char *)local_608,this->Quiet);
        if (local_608 != local_5f8) {
          operator_delete(local_608,local_5f8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5d0);
        std::ios_base::~ios_base(local_560);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5d0);
      cVar4 = (char)(ostringstream *)local_5d0;
      std::ios::widen((char)local_5d0[0][-3] + cVar4);
      std::ostream::put(cVar4);
      std::ostream::flush();
      pcVar2 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x536,(char *)local_608,this->Quiet);
      if (local_608 != local_5f8) {
        operator_delete(local_608,local_5f8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5d0);
      std::ios_base::~ios_base(local_560);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_458);
      std::ios_base::~ios_base(local_3e8);
      cmCTestRunTest::~cmCTestRunTest((cmCTestRunTest *)local_2b8);
      cmWorkingDirectory::~cmWorkingDirectory(&local_2e0);
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(local_5d8);
    } while (p_Var8 != local_5e0);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b8);
  std::ios::widen((char)(ostringstream *)local_2b8 +
                  (char)(((cmCTestTestProperties *)(local_2b8._0_8_ + -0x300))->ResourceGroups).
                        super__Vector_base<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::ostream::put((char)local_2b8);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Total Tests: ",0xd);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  pcVar2 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
               ,0x53c,(char *)local_458[0],this->Quiet);
  if (local_458[0] != local_448) {
    operator_delete(local_458[0],local_448[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b8);
  std::ios_base::~ios_base((ios_base *)(local_2b8 + 0x70));
  return;
}

Assistant:

void cmCTestMultiProcessHandler::PrintTestList()
{
  if (this->CTest->GetOutputAsJson()) {
    this->PrintOutputAsJson();
    return;
  }

  this->TestHandler->SetMaxIndex(this->FindMaxIndex());

  for (auto& it : this->Properties) {
    cmCTestTestHandler::cmCTestTestProperties& p = *it.second;

    // Don't worry if this fails, we are only showing the test list, not
    // running the tests
    cmWorkingDirectory workdir(p.Directory);

    cmCTestRunTest testRun(*this);
    testRun.SetIndex(p.Index);
    testRun.SetTestProperties(&p);
    testRun.ComputeArguments(); // logs the command in verbose mode

    if (!p.Labels.empty()) // print the labels
    {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "Labels:", this->Quiet);
    }
    for (std::string const& label : p.Labels) {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, " " << label,
                         this->Quiet);
    }
    if (!p.Labels.empty()) // print the labels
    {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, std::endl,
                         this->Quiet);
    }

    if (this->TestHandler->MemCheck) {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "  Memory Check",
                         this->Quiet);
    } else {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "  Test", this->Quiet);
    }
    std::ostringstream indexStr;
    indexStr << " #" << p.Index << ":";
    cmCTestOptionalLog(
      this->CTest, HANDLER_OUTPUT,
      std::setw(3 + getNumWidth(this->TestHandler->GetMaxIndex()))
        << indexStr.str(),
      this->Quiet);
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, " " << p.Name,
                       this->Quiet);
    if (p.Disabled) {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, " (Disabled)",
                         this->Quiet);
    }
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, std::endl, this->Quiet);
  }

  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     std::endl
                       << "Total Tests: " << this->Total << std::endl,
                     this->Quiet);
}